

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
emplaceValue<QGuiApplicationPrivate::SynthesizedMouseData>
          (Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *this,
          SynthesizedMouseData *args)

{
  SynthesizedMouseData *in_RDI;
  long in_FS_OFFSET;
  SynthesizedMouseData *this_00;
  SynthesizedMouseData local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_38;
  QGuiApplicationPrivate::SynthesizedMouseData::SynthesizedMouseData(this_00,in_RDI);
  QGuiApplicationPrivate::SynthesizedMouseData::operator=(this_00,in_RDI);
  QGuiApplicationPrivate::SynthesizedMouseData::~SynthesizedMouseData
            ((SynthesizedMouseData *)0x387e39);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }